

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialog::QColorDialog(QColorDialog *this,QColor *initial,QWidget *parent)

{
  QColorDialogPrivate *this_00;
  
  this_00 = (QColorDialogPrivate *)operator_new(0x3b0);
  QColorDialogPrivate::QColorDialogPrivate(this_00);
  QDialog::QDialog(&this->super_QDialog,(QDialogPrivate *)this_00,parent,(WindowFlags)0x8003003);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_007da068;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QColorDialog_007da240;
  QColorDialogPrivate::init
            (*(QColorDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)initial);
  return;
}

Assistant:

QColorDialog::QColorDialog(const QColor &initial, QWidget *parent)
    : QDialog(*new QColorDialogPrivate, parent, qcd_DefaultWindowFlags)
{
    Q_D(QColorDialog);
    d->init(initial);
}